

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu383.c
# Opt level: O0

MPP_RET hal_vp9d_vdpu383_flush(void *hal)

{
  long lVar1;
  Vdpu383Vp9dCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if ((hal_vp9d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp9d_vdpu383","(%d) enter\n","hal_vp9d_vdpu383_flush",0x528);
  }
  *(undefined4 *)(lVar1 + 0xf8) = 0xffffffff;
  *(undefined4 *)(lVar1 + 0xfc) = 0xffffffff;
  if ((hal_vp9d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp9d_vdpu383","(%d) leave\n","hal_vp9d_vdpu383_flush",0x52d);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp9d_vdpu383_flush(void *hal)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu383Vp9dCtx *hw_ctx = (Vdpu383Vp9dCtx*)p_hal->hw_ctx;

    hal_vp9d_enter();

    hw_ctx->mv_base_addr = -1;
    hw_ctx->pre_mv_base_addr = -1;

    hal_vp9d_leave();

    return MPP_OK;
}